

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

void __thiscall
gl4cts::GLSL420Pack::BindingUniformBlockArrayTest::releaseResource
          (BindingUniformBlockArrayTest *this)

{
  buffer *pbVar1;
  int iVar2;
  undefined4 extraout_var;
  GLuint i;
  long lVar3;
  buffer *buffers [14];
  buffer *local_88 [15];
  
  local_88[0] = &this->m_goku_00_buffer;
  local_88[1] = &this->m_goku_01_buffer;
  local_88[2] = &this->m_goku_02_buffer;
  local_88[3] = &this->m_goku_03_buffer;
  local_88[4] = &this->m_goku_04_buffer;
  local_88[5] = &this->m_goku_05_buffer;
  local_88[6] = &this->m_goku_06_buffer;
  local_88[7] = &this->m_goku_07_buffer;
  local_88[8] = &this->m_goku_08_buffer;
  local_88[9] = &this->m_goku_09_buffer;
  local_88[10] = &this->m_goku_10_buffer;
  local_88[0xb] = &this->m_goku_11_buffer;
  local_88[0xc] = &this->m_goku_12_buffer;
  local_88[0xd] = &this->m_goku_13_buffer;
  lVar3 = 0;
  do {
    pbVar1 = local_88[lVar3];
    if (pbVar1->m_id != 0) {
      iVar2 = (*pbVar1->m_context->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,pbVar1);
      pbVar1->m_id = 0;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0xe);
  return;
}

Assistant:

void BindingUniformBlockArrayTest::releaseResource()
{
	Utils::buffer* buffers[14] = { &m_goku_00_buffer, &m_goku_01_buffer, &m_goku_02_buffer, &m_goku_03_buffer,
								   &m_goku_04_buffer, &m_goku_05_buffer, &m_goku_06_buffer, &m_goku_07_buffer,
								   &m_goku_08_buffer, &m_goku_09_buffer, &m_goku_10_buffer, &m_goku_11_buffer,
								   &m_goku_12_buffer, &m_goku_13_buffer };

	for (GLuint i = 0; i < 14; ++i)
	{
		buffers[i]->release();
	}
}